

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O1

void __thiscall
icu_63::ArgExtractor::ArgExtractor
          (ArgExtractor *this,NumberFormat *param_1,Formattable *obj,UErrorCode *param_3)

{
  UObject *pUVar1;
  long lVar2;
  
  this->num = obj;
  this->fWasCurrency = '\0';
  pUVar1 = Formattable::getObject(obj);
  if ((pUVar1 != (UObject *)0x0) &&
     (lVar2 = __dynamic_cast(pUVar1,&UObject::typeinfo,&CurrencyAmount::typeinfo,0), lVar2 != 0)) {
    u_strcpy_63(this->save,(UChar *)(*(long *)(lVar2 + 0x78) + 0x14));
    this->num = (Formattable *)(lVar2 + 8);
    this->fWasCurrency = '\x01';
    return;
  }
  this->save[0] = L'\0';
  return;
}

Assistant:

ArgExtractor::ArgExtractor(const NumberFormat& /*nf*/, const Formattable& obj, UErrorCode& /*status*/)
  : num(&obj), fWasCurrency(FALSE) {

    const UObject* o = obj.getObject(); // most commonly o==NULL
    const CurrencyAmount* amt;
    if (o != NULL && (amt = dynamic_cast<const CurrencyAmount*>(o)) != NULL) {
        // getISOCurrency() returns a pointer to internal storage, so we
        // copy it to retain it across the call to setCurrency().
        //const UChar* curr = amt->getISOCurrency();
        u_strcpy(save, amt->getISOCurrency());
        num = &amt->getNumber();
        fWasCurrency=TRUE;
    } else {
      save[0]=0;
    }
}